

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_status_t flat_file_update(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  uint7 uVar1;
  int iVar2;
  char cVar3;
  ion_err_t iVar4;
  ion_status_t iVar5;
  ion_status_t iVar6;
  ion_flat_file_row_t local_70;
  undefined1 local_52;
  byte local_51;
  undefined1 local_50 [6];
  ion_err_t row_err;
  ion_err_t err;
  ion_flat_file_row_t row;
  ion_fpos_t loc;
  ion_status_t status;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_flat_file_t *flat_file_local;
  ion_status_t iVar7;
  
  loc = 0;
  row.value = (ion_value_t)0xffffffffffffffff;
  if (flat_file->sorted_mode != '\0') {
    local_51 = flat_file_binary_search(flat_file,key,(ion_fpos_t *)&row.value);
    if (local_51 != 0) {
      if (local_51 == 1) {
        iVar5 = flat_file_insert(flat_file,key,value);
        return iVar5;
      }
      loc = (ion_fpos_t)local_51;
      iVar5.error = (undefined1)loc;
      iVar5._1_3_ = loc._1_3_;
      iVar5.count = loc._4_4_;
      return iVar5;
    }
    local_51 = flat_file_read_row(flat_file,(ion_fpos_t)row.value,(ion_flat_file_row_t *)local_50);
    if (local_51 != 0) {
      loc = (ion_fpos_t)local_51;
      iVar7.error = (undefined1)loc;
      iVar7._1_3_ = loc._1_3_;
      iVar7.count = loc._4_4_;
      return iVar7;
    }
    cVar3 = (*(flat_file->super).compare)
                      ((ion_key_t)row._0_8_,key,(flat_file->super).record.key_size);
    if (cVar3 != '\0') {
      iVar5 = flat_file_insert(flat_file,key,value);
      return iVar5;
    }
  }
  while( true ) {
    local_51 = flat_file_scan(flat_file,(ion_fpos_t)row.value,(ion_fpos_t *)&row.value,
                              (ion_flat_file_row_t *)local_50,'\x01',flat_file_predicate_key_match,
                              key);
    uVar1 = loc._1_7_;
    iVar2 = loc._4_4_;
    if (local_51 != 0) {
      loc = (ulong)uVar1 << 8;
      if ((local_51 == 0xe) && (iVar2 == 0)) {
        flat_file_local = (ion_flat_file_t *)flat_file_insert(flat_file,key,value);
      }
      else {
        if (local_51 != 0xe) {
          loc = CONCAT71(uVar1,local_51);
        }
        flat_file_local = (ion_flat_file_t *)loc;
      }
      return (ion_status_t)flat_file_local;
    }
    local_70.row_status = '\x01';
    local_70.key = key;
    local_70.value = value;
    iVar4 = flat_file_write_row(flat_file,(ion_fpos_t)row.value,&local_70);
    if (iVar4 != '\0') break;
    loc = (ulong)(loc._4_4_ + 1) << 0x20;
    row.value = (ion_value_t)((long)row.value + 1);
    local_52 = 0;
  }
  loc._1_3_ = (undefined3)uVar1;
  loc._4_4_ = SUB74(uVar1,3);
  iVar6.error = iVar4;
  iVar6._1_3_ = loc._1_3_;
  iVar6.count = loc._4_4_;
  return iVar6;
}

Assistant:

ion_status_t
flat_file_update(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t status		= ION_STATUS_INITIALIZE;

	ion_fpos_t			loc = -1;
	ion_flat_file_row_t row;
	ion_err_t			err;

	if (flat_file->sorted_mode) {
		err = flat_file_binary_search(flat_file, key, &loc);

		if (err_ok != err) {
			if (err_item_not_found == err) {
				/* Key didn't exist, do upsert. This may fail because it violates the sorted order. */
				return flat_file_insert(flat_file, key, value);
			}

			status.error = err;
			return status;
		}

		err = flat_file_read_row(flat_file, loc, &row);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		if (0 != flat_file->super.compare(row.key, key, flat_file->super.record.key_size)) {
			/* Key didn't exist, do upsert. */
			return flat_file_insert(flat_file, key, value);
		}
	}

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_err_t row_err = flat_file_write_row(flat_file, loc, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_OCCUPIED, key, value });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		status.count++;
		/* Move one-forwards to skip the one we just updated */
		loc++;
	}

	status.error = err_ok;

	if ((err == err_file_hit_eof) && (status.count == 0)) {
		/* If this is the case, then we had nothing to update. Do an upsert instead */
		return flat_file_insert(flat_file, key, value);
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}